

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  char *__src;
  
  sVar1 = curlx_sotouz(state->offset);
  uVar3 = sVar1 - numbytes;
  if (sVar1 < numbytes) {
    uVar4 = numbytes - sVar1;
    __src = bytes + sVar1;
  }
  else {
    sVar2 = strlen(trail);
    __src = trail + uVar3;
    uVar4 = sVar2 - uVar3;
    if (sVar2 < uVar3 || uVar4 == 0) {
      return 0;
    }
  }
  if (uVar4 < bufsize) {
    bufsize = uVar4;
  }
  memcpy(buffer,__src,bufsize);
  state->offset = state->offset + bufsize;
  return bufsize;
}

Assistant:

static size_t readback_bytes(struct mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail)
{
  size_t sz;
  size_t offset = curlx_sotouz(state->offset);

  if(numbytes > offset) {
    sz = numbytes - offset;
    bytes += offset;
  }
  else {
    size_t tsz = strlen(trail);

    sz = offset - numbytes;
    if(sz >= tsz)
      return 0;
    bytes = trail + sz;
    sz = tsz - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}